

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

bool fmt::v8::detail::dragonbox::is_center_integer<double>
               (carrier_uint two_f,int exponent,int minus_k)

{
  int minus_k_local;
  int exponent_local;
  carrier_uint two_f_local;
  
  if (exponent < 0x57) {
    if (exponent < 10) {
      if (exponent < -4) {
        two_f_local._7_1_ = divisible_by_power_of_2(two_f,(minus_k - exponent) + 1);
      }
      else {
        two_f_local._7_1_ = true;
      }
    }
    else {
      two_f_local._7_1_ = divisible_by_power_of_5(two_f,minus_k);
    }
  }
  else {
    two_f_local._7_1_ = false;
  }
  return two_f_local._7_1_;
}

Assistant:

bool is_center_integer(typename float_info<T>::carrier_uint two_f, int exponent,
                       int minus_k) FMT_NOEXCEPT {
  // Exponent for 5 is negative.
  if (exponent > float_info<T>::divisibility_check_by_5_threshold) return false;
  if (exponent > float_info<T>::case_fc_upper_threshold)
    return divisible_by_power_of_5(two_f, minus_k);
  // Both exponents are nonnegative.
  if (exponent >= float_info<T>::case_fc_lower_threshold) return true;
  // Exponent for 2 is negative.
  return divisible_by_power_of_2(two_f, minus_k - exponent + 1);
}